

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# global_data.h
# Opt level: O0

void __thiscall
shared_data::print_update
          (shared_data *this,bool holdout_set_off,size_t current_pass,uint32_t label,
          uint32_t prediction,size_t num_features,bool progress_add,float progress_arg)

{
  _Setw progress_arg_00;
  ostream *poVar1;
  void *this_00;
  undefined8 uVar2;
  uint in_ECX;
  byte in_SIL;
  uint in_R8D;
  byte in_stack_00000008;
  ostringstream pred_buf;
  ostringstream label_buf;
  string local_380 [32];
  string local_360 [39];
  char local_339;
  int local_338;
  char local_331;
  undefined1 in_stack_fffffffffffffcd7;
  size_t in_stack_fffffffffffffcd8;
  string *in_stack_fffffffffffffce0;
  string *in_stack_fffffffffffffce8;
  size_t in_stack_fffffffffffffcf0;
  undefined1 in_stack_fffffffffffffcff;
  shared_data *in_stack_fffffffffffffd00;
  ostream local_1a8;
  byte local_29;
  uint local_20;
  uint local_1c;
  byte local_9;
  
  local_9 = in_SIL & 1;
  local_29 = in_stack_00000008 & 1;
  local_20 = in_R8D;
  local_1c = in_ECX;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1a8);
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&stack0xfffffffffffffce0);
  progress_arg_00 = std::setw(8);
  poVar1 = std::operator<<(&local_1a8,progress_arg_00);
  local_331 = (char)std::setfill<char>(' ');
  std::operator<<(poVar1,local_331);
  if (local_1c < 0x7fffffff) {
    this_00 = (void *)std::ostream::operator<<(&local_1a8,std::right);
    std::ostream::operator<<(this_00,local_1c);
  }
  else {
    poVar1 = (ostream *)std::ostream::operator<<(&local_1a8,std::left);
    std::operator<<(poVar1," unknown");
  }
  local_338 = (int)std::setw(8);
  poVar1 = std::operator<<((ostream *)&stack0xfffffffffffffce0,(_Setw)local_338);
  uVar2 = std::ostream::operator<<(poVar1,std::right);
  local_339 = (char)std::setfill<char>(' ');
  poVar1 = std::operator<<(uVar2,local_339);
  std::ostream::operator<<(poVar1,local_20);
  std::__cxx11::ostringstream::str();
  std::__cxx11::ostringstream::str();
  print_update(in_stack_fffffffffffffd00,(bool)in_stack_fffffffffffffcff,in_stack_fffffffffffffcf0,
               in_stack_fffffffffffffce8,in_stack_fffffffffffffce0,in_stack_fffffffffffffcd8,
               (bool)in_stack_fffffffffffffcd7,(float)progress_arg_00._M_n);
  std::__cxx11::string::~string(local_380);
  std::__cxx11::string::~string(local_360);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&stack0xfffffffffffffce0);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_1a8);
  return;
}

Assistant:

void print_update(bool holdout_set_off, size_t current_pass, uint32_t label, uint32_t prediction, size_t num_features,
      bool progress_add, float progress_arg)
  {
    std::ostringstream label_buf, pred_buf;

    label_buf << std::setw(col_current_label) << std::setfill(' ');
    if (label < INT_MAX)
      label_buf << std::right << label;
    else
      label_buf << std::left << " unknown";

    pred_buf << std::setw(col_current_predict) << std::right << std::setfill(' ') << prediction;

    print_update(
        holdout_set_off, current_pass, label_buf.str(), pred_buf.str(), num_features, progress_add, progress_arg);
  }